

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O0

int __thiscall cali::util::Args::ArgsImpl::parse(ArgsImpl *this,int argc,char **argv,int pos)

{
  char *pcVar1;
  _Rb_tree_color *p_Var2;
  iterator iVar3;
  __type _Var4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  undefined1 *puVar9;
  pointer ppVar10;
  reference pvVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  key_type_conflict *__x;
  pointer ppVar14;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  allocator<char> local_169;
  string local_168 [32];
  undefined1 local_148 [8];
  string optarg_1;
  _Self local_120;
  iterator it_1;
  size_type n;
  size_type dpos_1;
  size_type sps;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 local_c8 [8];
  string optarg;
  key_type local_a0;
  _Self local_80;
  iterator it;
  size_type dpos;
  size_type lps;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string arg;
  int i;
  int pos_local;
  char **argv_local;
  int argc_local;
  ArgsImpl *this_local;
  
  this_local._4_4_ = pos;
  if (pos < argc) {
    arg.field_2._12_4_ = pos;
    std::__cxx11::string::operator=((string *)&this->m_programname,*argv);
    arg.field_2._8_4_ = arg.field_2._12_4_;
    if ((int)arg.field_2._12_4_ < argc) {
      pcVar1 = argv[(int)arg.field_2._12_4_];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar1,&local_51);
      std::allocator<char>::~allocator(&local_51);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,&this->m_options_end);
        if (_Var4) {
          lps._0_4_ = 2;
        }
        else {
          std::__cxx11::string::size();
          uVar7 = std::__cxx11::string::empty();
          if (((uVar7 & 1) == 0) &&
             (lVar8 = std::__cxx11::string::find((string *)local_50,(ulong)&this->m_longopt_prefix),
             lVar8 == 0)) {
            it._M_node = (_Base_ptr)std::__cxx11::string::find((char)local_50,0x3d);
            std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_50);
            local_80._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::find(&this->m_long_options,&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
            optarg.field_2._8_8_ =
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::end(&this->m_long_options);
            bVar5 = std::operator==(&local_80,(_Self *)((long)&optarg.field_2 + 8));
            if (bVar5) {
              lps._0_4_ = 1;
            }
            else {
              std::__cxx11::string::string((string *)local_c8);
              if ((it._M_node != (_Base_ptr)0xffffffffffffffff) &&
                 (p_Var2 = &(it._M_node)->_M_color,
                 puVar9 = (undefined1 *)std::__cxx11::string::size(),
                 (byte *)((long)p_Var2 + 1U) < puVar9)) {
                std::__cxx11::string::assign
                          ((string *)local_c8,(ulong)local_50,
                           (ulong)((long)&(it._M_node)->_M_color + 1));
              }
              ppVar10 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                        ::operator->(&local_80);
              pvVar11 = std::
                        vector<cali::util::Args::Table,_std::allocator<cali::util::Args::Table>_>::
                        operator[](&this->m_options,ppVar10->second);
              if ((((pvVar11->has_argument & 1U) != 0) &&
                  (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) &&
                 (arg.field_2._8_4_ + 1 < argc)) {
                arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
                std::__cxx11::string::assign(local_c8);
              }
              ppVar10 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                        ::operator->(&local_80);
              std::make_pair<unsigned_long&,std::__cxx11::string&>
                        (&local_f0,&ppVar10->second,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
              std::
              map<unsigned_long,std::__cxx11::string,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
              ::insert<std::pair<unsigned_long,std::__cxx11::string>>
                        ((map<unsigned_long,std::__cxx11::string,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                          *)&this->m_active_options,&local_f0);
              std::
              pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair(&local_f0);
              lps._0_4_ = 4;
              std::__cxx11::string::~string((string *)local_c8);
            }
          }
          else {
            p_Var12 = (_Base_ptr)std::__cxx11::string::size();
            uVar7 = std::__cxx11::string::empty();
            if (((uVar7 & 1) == 0) &&
               (lVar8 = std::__cxx11::string::find
                                  ((string *)local_50,(ulong)&this->m_shortopt_prefix), lVar8 == 0))
            {
              p_Var13 = (_Base_ptr)std::__cxx11::string::find((char)local_50,0x3d);
              for (it_1._M_node = p_Var12; iVar3._M_node = it_1._M_node,
                  p_Var12 = (_Base_ptr)std::__cxx11::string::size(),
                  iVar3._M_node < p_Var12 && it_1._M_node < p_Var13;
                  it_1._M_node = (_Base_ptr)((long)&(it_1._M_node)->_M_color + 1)) {
                __x = (key_type_conflict *)std::__cxx11::string::operator[]((ulong)local_50);
                local_120._M_node =
                     (_Base_ptr)
                     std::
                     map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                     ::find(&this->m_short_options,__x);
                optarg_1.field_2._8_8_ =
                     std::
                     map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                     ::end(&this->m_short_options);
                bVar5 = std::operator==(&local_120,(_Self *)((long)&optarg_1.field_2 + 8));
                if (bVar5) {
                  lps._0_4_ = 1;
                  goto LAB_00113791;
                }
                std::__cxx11::string::string((string *)local_148);
                puVar9 = (undefined1 *)std::__cxx11::string::size();
                if (((byte *)((long)&p_Var13->_M_color + 1U) < puVar9) &&
                   (it_1._M_node == (_Base_ptr)((long)&p_Var13[-1]._M_right + 7))) {
                  std::__cxx11::string::assign
                            ((string *)local_148,(ulong)local_50,
                             (ulong)((long)&p_Var13->_M_color + 1));
                }
                iVar3._M_node = it_1._M_node;
                lVar8 = std::__cxx11::string::size();
                if (iVar3._M_node == (_Base_ptr)(lVar8 + -1)) {
                  ppVar14 = std::_Rb_tree_iterator<std::pair<const_char,_unsigned_long>_>::
                            operator->(&local_120);
                  pvVar11 = std::
                            vector<cali::util::Args::Table,_std::allocator<cali::util::Args::Table>_>
                            ::operator[](&this->m_options,ppVar14->second);
                  if (((pvVar11->has_argument & 1U) != 0) && (arg.field_2._8_4_ + 1 < argc)) {
                    lVar8 = (long)(int)arg.field_2._8_4_;
                    arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
                    pcVar1 = argv[lVar8 + 1];
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>(local_168,pcVar1,&local_169);
                    std::__cxx11::string::assign((string *)local_148);
                    std::__cxx11::string::~string(local_168);
                    std::allocator<char>::~allocator(&local_169);
                  }
                }
                ppVar14 = std::_Rb_tree_iterator<std::pair<const_char,_unsigned_long>_>::operator->
                                    (&local_120);
                std::make_pair<unsigned_long&,std::__cxx11::string&>
                          (&local_198,&ppVar14->second,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148);
                std::
                map<unsigned_long,std::__cxx11::string,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                ::insert<std::pair<unsigned_long,std::__cxx11::string>>
                          ((map<unsigned_long,std::__cxx11::string,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                            *)&this->m_active_options,&local_198);
                std::
                pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair(&local_198);
                std::__cxx11::string::~string((string *)local_148);
              }
              lps._0_4_ = 4;
            }
            else {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &this->m_arguments,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
              lps._0_4_ = 0;
            }
          }
        }
      }
      else {
        lps._0_4_ = 4;
      }
LAB_00113791:
      std::__cxx11::string::~string((string *)local_50);
      iVar6 = (*(code *)(&DAT_0011a49c + *(int *)(&DAT_0011a49c + (ulong)(uint)lps * 4)))();
      return iVar6;
    }
    while (arg.field_2._8_4_ = arg.field_2._8_4_ + 1, (int)arg.field_2._8_4_ < argc) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_arguments,argv + (int)arg.field_2._8_4_);
    }
    this_local._4_4_ = arg.field_2._8_4_;
  }
  return this_local._4_4_;
}

Assistant:

int parse(int argc, const char* const argv[], int pos)
    {
        if (argc <= pos)
            return pos;

        m_programname = argv[0];

        int i;

        for (i = pos; i < argc; ++i) {
            std::string arg { argv[i] };

            if (arg.empty())
                continue;
            if (arg == m_options_end)
                break;

            // --- handle long options

            auto lps = m_longopt_prefix.size();

            if (!m_longopt_prefix.empty() && arg.find(m_longopt_prefix) == 0) {
                std::string::size_type dpos = arg.find('=');

                auto it = m_long_options.find(arg.substr(lps, dpos == std::string::npos ? dpos : dpos - lps));

                if (it == m_long_options.end())
                    return i;

                std::string optarg;

                if (dpos != std::string::npos && dpos + 1 < arg.size())
                    optarg.assign(arg, dpos + 1, std::string::npos);
                if (m_options[it->second].has_argument && optarg.empty() && i + 1 < argc)
                    optarg.assign(argv[++i]);

                m_active_options.insert(make_pair(it->second, optarg));

                continue;
            }

            // handle short options

            auto sps = m_shortopt_prefix.size();

            if (!m_shortopt_prefix.empty() && arg.find(m_shortopt_prefix) == 0) {
                std::string::size_type dpos = arg.find('=');

                // handle characters in the shortopt string; last one may have an option argument
                for (auto n = sps; n < arg.size() && n < dpos; ++n) {
                    auto it = m_short_options.find(arg[n]);

                    if (it == m_short_options.end())
                        return i;

                    std::string optarg;

                    if (dpos + 1 < arg.size() && n == dpos - 1)
                        optarg.assign(arg, dpos + 1, std::string::npos);
                    if (n == arg.size() - 1 && m_options[it->second].has_argument && (i + 1) < argc)
                        optarg.assign(std::string(argv[++i]));

                    m_active_options.insert(make_pair(it->second, optarg));
                }

                continue;
            }

            // this is a non-option argument
            m_arguments.emplace_back(arg);
        }

        // treat all remaining elements as arguments (i.e., not options)

        for (++i; i < argc; ++i)
            m_arguments.emplace_back(argv[i]);

        return i;
    }